

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O1

void CallMission(char *str)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  int CurLbl;
  int local_1c;
  
  local_1c = -1;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (bMissionRunning == 0) {
    memset(labels,0,0x1000);
    memset(procdefineaddrs,0,0x400);
    memset(procreturnaddrs,0,0x400);
    memset(procstackids,0,0x400);
    procstack = 0;
    missionfile = (FILE *)fopen(str,"r");
    if ((FILE *)missionfile != (FILE *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
      pcVar3 = strtimeex_fns();
      sprintf(logmissionfilename,"log/logmission_%.64s.csv",pcVar3);
      pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
      logmissionfile = (FILE *)fopen(logmissionfilename,"w");
      if ((FILE *)logmissionfile == (FILE *)0x0) {
        puts("Unable to create log file.");
      }
      else {
        fprintf((FILE *)logmissionfile,
                "%% Time (in s); Lat (in deg); Long (in deg); Depth (in m); Action;\n");
        fflush((FILE *)logmissionfile);
      }
      if ((AutoResumeMissionMode == 1 || bMissionPaused != 0) ||
         ((AutoResumeMissionMode == 2 && (bMissionAtStartup != 0)))) {
        pFVar2 = fopen("log/CurLbl.txt","r");
        if (pFVar2 != (FILE *)0x0) {
          iVar1 = GetCurrentLabelEx("log/CurLbl.txt",&local_1c);
          if (iVar1 == 0) {
            puts("Resuming mission...");
            GotoMission(local_1c);
          }
        }
      }
      iVar1 = clock_getres(4,(timespec *)&chrono_mission.Frequency);
      if (iVar1 == 0) {
        iVar1 = clock_gettime(4,(timespec *)&chrono_mission);
        if (iVar1 == 0) {
          chrono_mission.Suspended = 0;
          chrono_mission.Finish.tv_sec = 0;
          chrono_mission.Finish.tv_nsec = 0;
          chrono_mission.Duration.tv_sec = 0;
          chrono_mission.Duration.tv_nsec = 0;
        }
      }
      puts("Mission started.");
      bMissionRunning = 1;
      goto LAB_00139fa9;
    }
    pcVar3 = "Mission file not found.";
  }
  else {
    pcVar3 = "A mission is already running.";
  }
  puts(pcVar3);
LAB_00139fa9:
  bMissionPaused = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void CallMission(char* str)
{
	int CurLbl = -1;

	EnterCriticalSection(&MissionFilesCS);
	if (!bMissionRunning)
	{
		memset(labels, 0, sizeof(labels));
		memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
		memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
		memset(procstackids, 0, sizeof(procstackids));
		procstack = 0;
		missionfile = fopen(str, "r");
		if (missionfile == NULL)
		{
			printf("Mission file not found.\n");
		}
		else
		{
			EnterCriticalSection(&strtimeCS);
			sprintf(logmissionfilename, LOG_FOLDER"logmission_%.64s.csv", strtimeex_fns());
			LeaveCriticalSection(&strtimeCS);
			logmissionfile = fopen(logmissionfilename, "w");
			if (logmissionfile == NULL)
			{
				printf("Unable to create log file.\n");
			}
			else
			{
				fprintf(logmissionfile, 
					"%% Time (in s); Lat (in deg); Long (in deg); Depth (in m); Action;\n"
					); 
				fflush(logmissionfile);
			}
			if ((bMissionPaused)||(AutoResumeMissionMode == MISSION_RESUME_NEXT)||((AutoResumeMissionMode == MISSION_RESUME_STARTUP)&&(bMissionAtStartup)))
			{
				if ((fopen(LOG_FOLDER"CurLbl.txt", "r"))&&(GetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", &CurLbl) == EXIT_SUCCESS))
				{
					printf("Resuming mission...\n");
					GotoMission(CurLbl);
				}
			}
			StartChrono(&chrono_mission);
			printf("Mission started.\n");
			bMissionRunning = TRUE;
		}
	}
	else
	{
		printf("A mission is already running.\n");
	}
	bMissionPaused = FALSE;
	LeaveCriticalSection(&MissionFilesCS);
}